

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * CreateNewWindow(char *name,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  void *pvVar4;
  ImGuiWindow *window_00;
  ImGuiWindowSettings *p;
  uint in_ESI;
  char *in_stack_00000010;
  ImGuiContext *in_stack_00000018;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  ImVector<ImGuiWindow_*> *this;
  ImGuiID id;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  ImGuiID in_stack_ffffffffffffffcc;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  
  pIVar2 = GImGui;
  this = (ImVector<ImGuiWindow_*> *)0x3d8;
  pvVar4 = ImGui::MemAlloc(0x3d8);
  id = (ImGuiID)((ulong)pvVar4 >> 0x20);
  window_00 = (ImGuiWindow *)operator_new(this);
  ImGuiWindow::ImGuiWindow((ImGuiWindow *)settings,in_stack_00000018,in_stack_00000010);
  window_00->Flags = in_ESI;
  ImGuiStorage::SetVoidPtr
            ((ImGuiStorage *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,60.0,60.0);
  IVar1.y = in_stack_ffffffffffffffc8;
  IVar1.x = in_stack_ffffffffffffffc4;
  window_00->Pos = IVar1;
  if (((in_ESI & 0x100) == 0) &&
     (p = ImGui::FindWindowSettings(id), p != (ImGuiWindowSettings *)0x0)) {
    iVar3 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&pIVar2->SettingsWindows,p);
    window_00->SettingsOffset = iVar3;
    SetWindowConditionAllowFlags(window_00,4,false);
    ApplyWindowSettings(in_stack_ffffffffffffffd0,
                        (ImGuiWindowSettings *)
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  (window_00->DC).CursorMaxPos = window_00->Pos;
  (window_00->DC).CursorStartPos = (window_00->DC).CursorMaxPos;
  if ((in_ESI & 0x40) == 0) {
    if ((window_00->Size).x <= 0.0) {
      window_00->AutoFitFramesX = '\x02';
    }
    if ((window_00->Size).y <= 0.0) {
      window_00->AutoFitFramesY = '\x02';
    }
    in_stack_ffffffffffffff9f = true;
    if (window_00->AutoFitFramesX < '\x01') {
      in_stack_ffffffffffffff9f = '\0' < window_00->AutoFitFramesY;
    }
    window_00->AutoFitOnlyGrows = (bool)in_stack_ffffffffffffff9f;
  }
  else {
    window_00->AutoFitFramesY = '\x02';
    window_00->AutoFitFramesX = '\x02';
    window_00->AutoFitOnlyGrows = false;
  }
  ImVector<ImGuiWindow_*>::push_back
            (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if ((in_ESI & 0x2000) == 0) {
    ImVector<ImGuiWindow_*>::push_back
              (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  else {
    ImVector<ImGuiWindow_*>::push_front
              (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  return window_00;
}

Assistant:

static ImGuiWindow* CreateNewWindow(const char* name, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("CreateNewWindow '%s', flags = 0x%08X\n", name, flags);

    // Create window the first time
    ImGuiWindow* window = IM_NEW(ImGuiWindow)(&g, name);
    window->Flags = flags;
    g.WindowsById.SetVoidPtr(window->ID, window);

    // Default/arbitrary window position. Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    window->Pos = ImVec2(60, 60);

    // User can disable loading and saving of settings. Tooltip and child windows also don't store settings.
    if (!(flags & ImGuiWindowFlags_NoSavedSettings))
        if (ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID))
        {
            // Retrieve settings from .ini file
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
            SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
            ApplyWindowSettings(window, settings);
        }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->Pos; // So first call to CalcContentSize() doesn't return crazy values

    if ((flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }

    g.WindowsFocusOrder.push_back(window);
    if (flags & ImGuiWindowFlags_NoBringToFrontOnFocus)
        g.Windows.push_front(window); // Quite slow but rare and only once
    else
        g.Windows.push_back(window);
    return window;
}